

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.hpp
# Opt level: O1

void __thiscall Satyricon::Literal_Heap::heapify(Literal_Heap *this,size_type i)

{
  double *pdVar1;
  ulong uVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  pointer pLVar6;
  pointer pdVar7;
  pointer piVar8;
  ulong uVar9;
  ulong uVar10;
  
  while( true ) {
    uVar2 = i * 2 + 1;
    pLVar6 = (this->value).
             super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = (long)(this->value).
                   super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pLVar6 >> 2;
    uVar9 = i;
    if ((uVar2 < uVar10) &&
       (pdVar7 = (this->activity->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start, dVar3 = pdVar7[(uint)pLVar6[uVar2].value],
       pdVar1 = pdVar7 + (uint)pLVar6[i].value, *pdVar1 <= dVar3 && dVar3 != *pdVar1)) {
      uVar9 = uVar2;
    }
    uVar2 = i * 2 + 2;
    if ((uVar2 < uVar10) &&
       (pdVar7 = (this->activity->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start, dVar3 = pdVar7[(uint)pLVar6[i * 2 + 2].value],
       pdVar1 = pdVar7 + (uint)pLVar6[uVar9].value, *pdVar1 <= dVar3 && dVar3 != *pdVar1)) {
      uVar9 = uVar2;
    }
    if (uVar9 == i) break;
    uVar4 = pLVar6[i].value;
    pLVar6[i].value = pLVar6[uVar9].value;
    pLVar6[uVar9].value = uVar4;
    piVar8 = (this->map_position).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = piVar8[(uint)pLVar6[i].value];
    piVar8[(uint)pLVar6[i].value] = piVar8[uVar4];
    piVar8[uVar4] = iVar5;
    i = uVar9;
  }
  return;
}

Assistant:

void heapify(size_type i) {
        //std::cout <<"heapify " << i << " " << left(i) << " " << right(i) << std::endl;
        auto largest = i;
        if (left(i) < value.size()  && activity[value[largest].index()] < activity[value[left(i)].index()] )
            largest = left(i);
        if (right(i) < value.size()  && activity[value[largest].index()] < activity[value[right(i)].index()] )
            largest = right(i);

        if ( largest != i ) {
            std::swap(value[i],value[largest]);
            std::swap(map_position[value[i].index()],
                    map_position[value[largest].index()]);

            heapify(largest);
        }
    }